

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_echo_server.cpp
# Opt level: O0

void __thiscall fd_dispatcher::fd_dispatcher(fd_dispatcher *this,int port,size_t thread_cnt)

{
  allocator<worker> *this_00;
  size_t __n;
  bool bVar1;
  pointer pwVar2;
  anon_class_1_0_00000001 local_109;
  undefined1 local_108 [8];
  pair<ranger::event::tcp_connection,_ranger::event::tcp_connection> conn_pair;
  __normal_iterator<worker_*,_std::vector<worker,_std::allocator<worker>_>_> local_70;
  iterator i;
  undefined1 local_60 [8];
  vector<worker,_std::allocator<worker>_> workers;
  endpoint local_30 [16];
  size_t local_20;
  size_t thread_cnt_local;
  fd_dispatcher *pfStack_10;
  int port_local;
  fd_dispatcher *this_local;
  
  local_20 = thread_cnt;
  thread_cnt_local._4_4_ = port;
  pfStack_10 = this;
  ranger::event::dispatcher::dispatcher(&this->m_disp);
  ranger::event::endpoint::endpoint(local_30,thread_cnt_local._4_4_);
  ranger::event::tcp_acceptor::tcp_acceptor(&this->m_acc,&this->m_disp,local_30,-1);
  std::vector<worker,_std::allocator<worker>_>::vector(&this->m_workers);
  this->m_worker_idx = 0;
  workers.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  ranger::event::tcp_acceptor::
  set_event_handler<fd_dispatcher::fd_dispatcher(int,unsigned_long)::_lambda(ranger::event::tcp_acceptor&,int)_1_>
            (&this->m_acc,
             (anon_class_8_1_8991fb9c *)
             &workers.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __n = local_20;
  this_00 = (allocator<worker> *)((long)&i._M_current + 7);
  std::allocator<worker>::allocator(this_00);
  std::vector<worker,_std::allocator<worker>_>::vector
            ((vector<worker,_std::allocator<worker>_> *)local_60,__n,this_00);
  std::allocator<worker>::~allocator((allocator<worker> *)((long)&i._M_current + 7));
  local_70._M_current =
       (worker *)
       std::vector<worker,_std::allocator<worker>_>::begin
                 ((vector<worker,_std::allocator<worker>_> *)local_60);
  while( true ) {
    conn_pair.second.m_extra_data =
         (void *)std::vector<worker,_std::allocator<worker>_>::end
                           ((vector<worker,_std::allocator<worker>_> *)local_60);
    bVar1 = __gnu_cxx::operator!=
                      (&local_70,
                       (__normal_iterator<worker_*,_std::vector<worker,_std::allocator<worker>_>_> *
                       )&conn_pair.second.m_extra_data);
    if (!bVar1) break;
    pwVar2 = __gnu_cxx::__normal_iterator<worker_*,_std::vector<worker,_std::allocator<worker>_>_>::
             operator->(&local_70);
    worker::event_dispatcher(pwVar2);
    ranger::event::tcp_connection::create_pair((dispatcher *)local_108,&this->m_disp);
    ranger::event::tcp_connection::
    set_event_handler<fd_dispatcher::fd_dispatcher(int,unsigned_long)::_lambda(ranger::event::tcp_connection&,ranger::event::tcp_connection::event_code)_1_>
              ((tcp_connection *)local_108,&local_109);
    pwVar2 = __gnu_cxx::__normal_iterator<worker_*,_std::vector<worker,_std::allocator<worker>_>_>::
             operator->(&local_70);
    worker::set_external_connection(pwVar2,(tcp_connection *)local_108);
    pwVar2 = __gnu_cxx::__normal_iterator<worker_*,_std::vector<worker,_std::allocator<worker>_>_>::
             operator->(&local_70);
    worker::set_internal_connection(pwVar2,(tcp_connection *)&conn_pair.first.m_extra_data);
    std::pair<ranger::event::tcp_connection,_ranger::event::tcp_connection>::~pair
              ((pair<ranger::event::tcp_connection,_ranger::event::tcp_connection> *)local_108);
    __gnu_cxx::__normal_iterator<worker_*,_std::vector<worker,_std::allocator<worker>_>_>::
    operator++(&local_70);
  }
  std::vector<worker,_std::allocator<worker>_>::operator=
            (&this->m_workers,(vector<worker,_std::allocator<worker>_> *)local_60);
  std::vector<worker,_std::allocator<worker>_>::~vector
            ((vector<worker,_std::allocator<worker>_> *)local_60);
  return;
}

Assistant:

fd_dispatcher(int port, size_t thread_cnt)
		: m_acc(m_disp, ranger::event::endpoint(port)) {
		m_acc.set_event_handler([this] (ranger::event::tcp_acceptor& acc, int fd) {
			return m_workers[m_worker_idx++ % m_workers.size()].take_fd(fd);
		});

		decltype(m_workers) workers(thread_cnt);
		for (auto i = workers.begin(); i != workers.end(); ++i) {
			auto conn_pair = ranger::event::tcp_connection::create_pair(m_disp, i->event_dispatcher());
			conn_pair.first.set_event_handler([] (ranger::event::tcp_connection& conn, ranger::event::tcp_connection::event_code what) {
				switch (what) {
				case ranger::event::tcp_connection::event_code::timeout:
				case ranger::event::tcp_connection::event_code::error:
				case ranger::event::tcp_connection::event_code::eof:
					conn.close();
					break;
				default:
					break;
				}
			});

			i->set_external_connection(std::move(conn_pair.first));
			i->set_internal_connection(std::move(conn_pair.second));
		}

		m_workers = std::move(workers);
	}